

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlUTF8Strpos(xmlChar *utf,int pos)

{
  byte bVar1;
  
  if (pos < 0 || utf == (xmlChar *)0x0) {
LAB_0015ed38:
    utf = (byte *)0x0;
  }
  else if (pos != 0) {
    do {
      bVar1 = *utf;
      if ((bVar1 == 0) ||
         ((utf = utf + 1, (char)bVar1 < '\0' && (((~bVar1 & 0xc0) != 0 || ((bVar1 & 0x40) != 0))))))
      goto LAB_0015ed38;
      pos = pos + -1;
    } while (pos != 0);
  }
  return utf;
}

Assistant:

const xmlChar *
xmlUTF8Strpos(const xmlChar *utf, int pos) {
    int ch;

    if (utf == NULL) return(NULL);
    if (pos < 0)
        return(NULL);
    while (pos--) {
        ch = *utf++;
        if (ch == 0)
            return(NULL);
        if ( ch & 0x80 ) {
            /* if not simple ascii, verify proper format */
            if ( (ch & 0xc0) != 0xc0 )
                return(NULL);
            /* then skip over remaining bytes for this char */
            while ( (ch <<= 1) & 0x80 )
                if ( (*utf++ & 0xc0) != 0x80 )
                    return(NULL);
        }
    }
    return((xmlChar *)utf);
}